

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetFrameworkDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,bool rootDir)

{
  bool bVar1;
  string sStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  GetOutputName(&sStack_38,this,config,false);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_38);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (!rootDir) {
    bVar1 = cmMakefile::PlatformIsAppleIos(this->Makefile);
    if (!bVar1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      GetFrameworkVersion_abi_cxx11_(&sStack_38,this);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&sStack_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmGeneratorTarget::GetFrameworkDirectory(const std::string& config,
                                         bool rootDir) const
{
  std::string fpath;
  fpath += this->GetOutputName(config, false);
  fpath += ".framework";
  if(!rootDir && !this->Makefile->PlatformIsAppleIos())
    {
    fpath += "/Versions/";
    fpath += this->GetFrameworkVersion();
    }
  return fpath;
}